

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::PumpNetwork(CClient *this)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  CClient *in_RDI;
  long in_FS_OFFSET;
  CNetChunk Packet;
  char aBuf [256];
  CNetClient *in_stack_fffffffffffffea8;
  CNetClient *in_stack_fffffffffffffeb0;
  CClient *pChunk;
  CClient *in_stack_fffffffffffffec8;
  CClient *in_stack_fffffffffffffed0;
  uint local_11c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pChunk = in_RDI;
  CNetClient::Update(in_stack_fffffffffffffeb0);
  iVar2 = IClient::State(&in_RDI->super_IClient);
  if (iVar2 != 4) {
    iVar2 = IClient::State(&in_RDI->super_IClient);
    if (((iVar2 != 0) && (iVar2 = IClient::State(&in_RDI->super_IClient), iVar2 != 5)) &&
       (iVar2 = CNetClient::State(in_stack_fffffffffffffea8), iVar2 == 0)) {
      SetState(in_RDI,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      CNetClient::ErrorString((CNetClient *)0x124bc7);
      DisconnectWithReason(in_stack_fffffffffffffec8,(char *)pChunk);
      in_stack_fffffffffffffeb0 = (CNetClient *)&stack0xfffffffffffffef8;
      pcVar3 = CNetClient::ErrorString((CNetClient *)0x124bef);
      str_format((char *)in_stack_fffffffffffffeb0,0x100,"offline error=\'%s\'",pcVar3);
      (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (in_RDI->m_pConsole,0,"client",&stack0xfffffffffffffef8);
    }
    iVar2 = IClient::State(&in_RDI->super_IClient);
    if ((iVar2 == 1) && (iVar2 = CNetClient::State(in_stack_fffffffffffffea8), iVar2 == 2)) {
      (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (in_RDI->m_pConsole,0,"client","connected, sending info");
      SetState(in_RDI,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      SendInfo(in_stack_fffffffffffffed0);
    }
  }
  while (iVar2 = CNetClient::Recv((CNetClient *)in_stack_fffffffffffffec8,(CNetChunk *)pChunk,
                                  (TOKEN *)in_RDI), iVar2 != 0) {
    if ((local_11c & 2) == 0) {
      ProcessServerPacket(in_RDI,(CNetChunk *)&stack0xfffffffffffffec8);
    }
  }
  CNetClient::Update(in_stack_fffffffffffffeb0);
  while (iVar2 = CNetClient::Recv((CNetClient *)in_stack_fffffffffffffec8,(CNetChunk *)pChunk,
                                  (TOKEN *)in_RDI), iVar2 != 0) {
    if ((local_11c & 2) != 0) {
      ProcessConnlessPacket(in_RDI,(CNetChunk *)&stack0xfffffffffffffec8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CClient::PumpNetwork()
{
	m_NetClient.Update();

	if(State() != IClient::STATE_DEMOPLAYBACK)
	{
		// check for errors
		if(State() != IClient::STATE_OFFLINE && State() != IClient::STATE_QUITING && m_NetClient.State() == NETSTATE_OFFLINE)
		{
			SetState(IClient::STATE_OFFLINE);
			DisconnectWithReason(m_NetClient.ErrorString());
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "offline error='%s'", m_NetClient.ErrorString());
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);
		}

		//
		if(State() == IClient::STATE_CONNECTING && m_NetClient.State() == NETSTATE_ONLINE)
		{
			// we switched to online
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", "connected, sending info");
			SetState(IClient::STATE_LOADING);
			SendInfo();
		}
	}

	// process non-connless packets
	CNetChunk Packet;
	while(m_NetClient.Recv(&Packet))
	{
		if(!(Packet.m_Flags&NETSENDFLAG_CONNLESS))
			ProcessServerPacket(&Packet);
	}

	// process connless packets data
	m_ContactClient.Update();
	while(m_ContactClient.Recv(&Packet))
	{
		if(Packet.m_Flags&NETSENDFLAG_CONNLESS)
			ProcessConnlessPacket(&Packet);
	}
}